

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O2

void amqp_value_decoded(void *context,AMQP_VALUE decoded_value)

{
  int iVar1;
  _Bool _Var2;
  AMQP_VALUE descriptor;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  
  descriptor = amqpvalue_get_inplace_descriptor(decoded_value);
  if (descriptor == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9e0;
    pcVar4 = "Cannot get frame descriptor";
    iVar1 = 0x32;
  }
  else {
    _Var2 = is_sasl_mechanisms_type_by_descriptor(descriptor);
    if (_Var2) {
LAB_0012b9a6:
      *(AMQP_VALUE *)((long)context + 0x30) = decoded_value;
      return;
    }
    _Var2 = is_sasl_init_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0012b9a6;
    _Var2 = is_sasl_challenge_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0012b9a6;
    _Var2 = is_sasl_response_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0012b9a6;
    _Var2 = is_sasl_outcome_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0012b9a6;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9e0;
    pcVar4 = "Not a SASL frame";
    iVar1 = 0x41;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
            ,"amqp_value_decoded",iVar1,1,pcVar4);
LAB_0012b9e0:
  *(undefined4 *)((long)context + 0x28) = 1;
  (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
  return;
}

Assistant:

static void amqp_value_decoded(void* context, AMQP_VALUE decoded_value)
{
    AMQP_FRAME_CODEC_HANDLE amqp_frame_codec = (AMQP_FRAME_CODEC_HANDLE)context;
    uint64_t performative_descriptor_ulong;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(decoded_value);

    /* Codes_SRS_AMQP_FRAME_CODEC_01_060: [If any error occurs while decoding a frame, the decoder shall switch to an error state where decoding shall not be possible anymore.] */
    if ((descriptor == NULL) ||
        (amqpvalue_get_ulong(descriptor, &performative_descriptor_ulong) != 0) ||
        /* Codes_SRS_AMQP_FRAME_CODEC_01_003: [The performative MUST be one of those defined in section 2.7 and is encoded as a described type in the AMQP type system.] */
        (performative_descriptor_ulong < AMQP_OPEN) ||
        (performative_descriptor_ulong > AMQP_CLOSE))
    {
        /* Codes_SRS_AMQP_FRAME_CODEC_01_060: [If any error occurs while decoding a frame, the decoder shall switch to an error state where decoding shall not be possible anymore.] */
        amqp_frame_codec->decode_state = AMQP_FRAME_DECODE_ERROR;
    }
    else
    {
        amqp_frame_codec->decoded_performative = decoded_value;
    }
}